

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::number_to_natural(size_t big,char *c)

{
  char *__format;
  
  if (big >> 10 < 0x9502f9) {
    if (big < 10000000) {
      if (big < 10000) {
        __format = "%d";
      }
      else {
        big = big / 1000;
        __format = "%dk";
      }
    }
    else {
      big = big / 1000000;
      __format = "%dm";
    }
  }
  else {
    big = big / 1000000000;
    __format = "%dg";
  }
  sprintf(c,__format,big);
  return;
}

Assistant:

void number_to_natural(size_t big, char* c)
{
  if (big > 9999999999)
    sprintf(c, "%dg", (int)(big / 1000000000));
  else if (big > 9999999)
    sprintf(c, "%dm", (int)(big / 1000000));
  else if (big > 9999)
    sprintf(c, "%dk", (int)(big / 1000));
  else
    sprintf(c, "%d", (int)(big));
}